

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

PaSampleFormat
PaUtil_SelectClosestAvailableFormat(PaSampleFormat availableFormats,PaSampleFormat format)

{
  ulong uVar1;
  ulong uVar2;
  bool local_22;
  bool local_21;
  ulong local_20;
  PaSampleFormat result;
  PaSampleFormat format_local;
  PaSampleFormat availableFormats_local;
  
  uVar1 = format & 0xffffffff7fffffff;
  uVar2 = availableFormats & 0xffffffff7fffffff;
  local_20 = uVar1;
  if ((uVar1 & uVar2) == 0) {
    if (uVar1 == 1) {
      local_20 = 0;
    }
    else {
      do {
        local_20 = local_20 >> 1;
        local_21 = (local_20 & uVar2) == 0 && local_20 != 0;
      } while (local_21);
    }
    if (local_20 == 0) {
      do {
        local_20 = uVar1;
        local_20 = local_20 << 1;
        local_22 = (local_20 & uVar2) == 0 && local_20 != 0x10000;
        uVar1 = local_20;
      } while (local_22);
      if ((local_20 & uVar2) == 0) {
        local_20 = 0xffffffffffffd8f6;
      }
    }
  }
  return local_20;
}

Assistant:

PaSampleFormat PaUtil_SelectClosestAvailableFormat(
        PaSampleFormat availableFormats, PaSampleFormat format )
{
    PaSampleFormat result;

    format &= ~paNonInterleaved;
    availableFormats &= ~paNonInterleaved;
    
    if( (format & availableFormats) == 0 )
    {
        /* NOTE: this code depends on the sample format constants being in
            descending order of quality - ie best quality is 0
            FIXME: should write an assert which checks that all of the
            known constants conform to that requirement.
        */

        if( format != 0x01 )
        {
            /* scan for better formats */
            result = format;
            do
            {
                result >>= 1;
            }
            while( (result & availableFormats) == 0 && result != 0 );
        }
        else
        {
            result = 0;
        }
        
        if( result == 0 ){
            /* scan for worse formats */
            result = format;
            do
            {
                result <<= 1;
            }
            while( (result & availableFormats) == 0 && result != paCustomFormat );

            if( (result & availableFormats) == 0 )
                result = paSampleFormatNotSupported;
        }
        
    }else{
        result = format;
    }

    return result;
}